

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.c
# Opt level: O0

int send_packet(packet *p,char *why)

{
  mbedtls_net_context *ctx;
  int iVar1;
  uint uVar2;
  uchar local_4838 [8];
  uchar buf [18432];
  mbedtls_net_context *dst;
  int ret;
  char *why_local;
  packet *p_local;
  
  ctx = p->dst;
  if ((opt.bad_ad != 0) && (iVar1 = strcmp(p->type,"ApplicationData"), iVar1 == 0)) {
    memcpy(local_4838,p->buf,(ulong)p->len);
    uVar2 = p->len - 1;
    local_4838[uVar2] = local_4838[uVar2] + '\x01';
    print_packet(p,"corrupted");
    uVar2 = mbedtls_net_send(ctx,local_4838,(ulong)p->len);
    if ((int)uVar2 < 1) {
      printf("  ! mbedtls_net_send returned %d\n",(ulong)uVar2);
      return uVar2;
    }
  }
  print_packet(p,why);
  p_local._4_4_ = mbedtls_net_send(ctx,p->buf,(ulong)p->len);
  if ((int)p_local._4_4_ < 1) {
    printf("  ! mbedtls_net_send returned %d\n",(ulong)p_local._4_4_);
  }
  else {
    if (((opt.duplicate != 0) && (iVar1 = strcmp(p->type,"ApplicationData"), iVar1 != 0)) &&
       (iVar1 = rand(), iVar1 % opt.duplicate == 0)) {
      print_packet(p,"duplicated");
      uVar2 = mbedtls_net_send(ctx,p->buf,(ulong)p->len);
      if ((int)uVar2 < 1) {
        printf("  ! mbedtls_net_send returned %d\n",(ulong)uVar2);
        return uVar2;
      }
    }
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int send_packet( const packet *p, const char *why )
{
    int ret;
    mbedtls_net_context *dst = p->dst;

    /* insert corrupted ApplicationData record? */
    if( opt.bad_ad &&
        strcmp( p->type, "ApplicationData" ) == 0 )
    {
        unsigned char buf[MAX_MSG_SIZE];
        memcpy( buf, p->buf, p->len );
        ++buf[p->len - 1];

        print_packet( p, "corrupted" );
        if( ( ret = mbedtls_net_send( dst, buf, p->len ) ) <= 0 )
        {
            mbedtls_printf( "  ! mbedtls_net_send returned %d\n", ret );
            return( ret );
        }
    }

    print_packet( p, why );
    if( ( ret = mbedtls_net_send( dst, p->buf, p->len ) ) <= 0 )
    {
        mbedtls_printf( "  ! mbedtls_net_send returned %d\n", ret );
        return( ret );
    }

    /* Don't duplicate Application Data, only handshake covered */
    if( opt.duplicate != 0 &&
        strcmp( p->type, "ApplicationData" ) != 0 &&
        rand() % opt.duplicate == 0 )
    {
        print_packet( p, "duplicated" );

        if( ( ret = mbedtls_net_send( dst, p->buf, p->len ) ) <= 0 )
        {
            mbedtls_printf( "  ! mbedtls_net_send returned %d\n", ret );
            return( ret );
        }
    }

    return( 0 );
}